

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

void __thiscall
cs_impl::any::holder<cs::pointer>::holder<cs_impl::any_const&>(holder<cs::pointer> *this,any *args)

{
  proxy *ppVar1;
  any local_8;
  
  (this->super_baseHolder)._vptr_baseHolder = (_func_int **)&PTR__holder_00254210;
  ppVar1 = args->mDat;
  if (ppVar1 != (proxy *)0x0) {
    ppVar1->refcount = ppVar1->refcount + 1;
  }
  (this->mDat).data.mDat = ppVar1;
  local_8.mDat = (proxy *)0x0;
  recycle(&local_8);
  return;
}

Assistant:

explicit holder(ArgsT &&...args):mDat(std::forward<ArgsT>(args)...) {}